

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void on_bytes_encoded(void *context,uchar *bytes,size_t length,_Bool encode_complete)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  _Bool encode_complete_local;
  size_t length_local;
  uchar *bytes_local;
  void *context_local;
  
  iVar1 = xio_send(*context,bytes,length,unchecked_on_send_complete,(void *)0x0);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"on_bytes_encoded",0x1fe,1,"xio_send failed");
    }
    handle_error((SASL_CLIENT_IO_INSTANCE *)context);
  }
  return;
}

Assistant:

static void on_bytes_encoded(void* context, const unsigned char* bytes, size_t length, bool encode_complete)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;
    if (xio_send(connection->io, bytes, length,
        (encode_complete && connection->on_send_complete != NULL) ? connection->on_send_complete : unchecked_on_send_complete,
        connection->on_send_complete_callback_context) != 0)
    {
        LogError("Cannot send encoded bytes");

        if (xio_close(connection->io, NULL, NULL) != 0)
        {
            LogError("xio_close failed");
        }

        connection_set_state(connection, CONNECTION_STATE_END);
    }
}